

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauGia.c
# Opt level: O2

int Dau_DsdToGia2_rec(Gia_Man_t *pGia,char *pStr,char **p,int *pMatches,int *pLits,Vec_Int_t *vCover
                     )

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  byte *pbVar9;
  uint uVar10;
  char *pcVar11;
  byte *pbVar12;
  bool bVar13;
  int *local_298;
  int Temp [3];
  Vec_Int_t vLeaves;
  int Fanins [12];
  
  pbVar9 = (byte *)*p;
  bVar1 = *pbVar9;
  bVar13 = bVar1 == 0x21;
  pbVar12 = pbVar9;
  if (bVar13) {
    pbVar12 = pbVar9 + 1;
    *p = (char *)pbVar12;
    bVar1 = pbVar9[1];
  }
  uVar10 = (uint)bVar13;
  if ((byte)(bVar1 + 0x9f) < 0xc) {
    iVar3 = pLits[(ulong)bVar1 - 0x61];
LAB_00432ce2:
    iVar4 = Abc_LitNotCond(iVar3,uVar10);
    return iVar4;
  }
  if (bVar1 != 0x5b) {
    if (bVar1 == 0x3c) {
      lVar7 = (long)pMatches[(long)pbVar12 - (long)pStr];
      lVar8 = 0;
      local_298 = pLits;
      if (pStr[lVar7 + 1] == '{') {
        pcVar11 = pStr + lVar7 + 1;
        *p = pcVar11;
        if ((*pcVar11 != '{') ||
           (pcVar11 = pStr + pMatches[(long)pcVar11 - (long)pStr], *pcVar11 != '}')) {
          __assert_fail("**p == \'{\' && *q2 == \'}\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauGia.c"
                        ,0x89,
                        "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        pcVar6 = pStr + lVar7 + 2;
        *p = pcVar6;
        lVar8 = 0;
        while (pcVar6 < pcVar11) {
          iVar4 = Dau_DsdToGia2_rec(pGia,pStr,p,pMatches,pLits,vCover);
          Fanins[lVar8] = iVar4;
          pcVar6 = *p + 1;
          *p = pcVar6;
          lVar8 = lVar8 + 1;
        }
        if (pcVar6 != pcVar11) {
          __assert_fail("*p == q2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauGia.c"
                        ,0x8c,
                        "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        lVar7 = (long)pMatches[(long)pbVar12 - (long)pStr];
        local_298 = Fanins;
      }
      *p = (char *)pbVar12;
      if ((*pbVar12 != 0x3c) || (pbVar9 = (byte *)(pStr + lVar7), *pbVar9 != 0x3e)) {
        __assert_fail("**p == \'<\' && *q == \'>\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauGia.c"
                      ,0x94,
                      "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      pbVar5 = pbVar12;
      if ((uint)lVar8 != 0) {
        while (pbVar5 < pbVar9) {
          bVar1 = *pbVar5;
          pbVar5 = pbVar5 + 1;
          if ((uint)lVar8 <= (uint)(byte)(bVar1 + 0x9f) && (byte)(bVar1 + 0x9f) < 0x1a) {
            __assert_fail("*pOld - \'a\' < nVars",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauGia.c"
                          ,0x99,
                          "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                         );
          }
        }
      }
      lVar8 = 0;
      while( true ) {
        pbVar5 = pbVar12 + 1;
        *p = (char *)pbVar5;
        if (pbVar9 <= pbVar5) break;
        iVar4 = Dau_DsdToGia2_rec(pGia,pStr,p,pMatches,local_298,vCover);
        *(int *)((long)Temp + lVar8) = iVar4;
        lVar8 = lVar8 + 4;
        pbVar12 = (byte *)*p;
      }
      if (lVar8 != 0xc) {
        __assert_fail("pTemp == Temp + 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauGia.c"
                      ,0x9d,
                      "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      if (pbVar5 != pbVar9) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauGia.c"
                      ,0x9e,
                      "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      if (pbVar9[1] == 0x7b) {
        *p = (char *)(pbVar12 + 2);
        if ((pbVar12[2] != 0x7b) || (pStr[pMatches[(long)(pbVar12 + 2) - (long)pStr]] != '}')) {
          __assert_fail("**p == \'{\' && *q == \'}\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauGia.c"
                        ,0xa2,
                        "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        *p = pStr + pMatches[(long)(pbVar12 + 2) - (long)pStr];
      }
      if (pGia->pMuxes == (uint *)0x0) {
        iVar4 = Gia_ManHashMux(pGia,Temp[0],Temp[1],Temp[2]);
      }
      else {
        iVar4 = Gia_ManHashMuxReal(pGia,Temp[0],Temp[1],Temp[2]);
      }
    }
    else {
      iVar3 = 1;
      if (bVar1 == 0x28) {
        iVar4 = pMatches[(long)pbVar12 - (long)pStr];
        if (pStr[iVar4] == ')') {
          while( true ) {
            pbVar12 = pbVar12 + 1;
            *p = (char *)pbVar12;
            if (pStr + iVar4 <= pbVar12) break;
            iVar2 = Dau_DsdToGia2_rec(pGia,pStr,p,pMatches,pLits,vCover);
            iVar3 = Gia_ManHashAnd(pGia,iVar3,iVar2);
            pbVar12 = (byte *)*p;
          }
          if (pbVar12 == (byte *)(pStr + iVar4)) goto LAB_00432ce2;
          pcVar11 = "*p == q";
          uVar10 = 0x69;
        }
        else {
          pcVar11 = "**p == \'(\' && *q == \')\'";
          uVar10 = 99;
        }
        goto LAB_00432f52;
      }
      if (5 < (byte)(bVar1 + 0xbf) && 9 < (byte)(bVar1 - 0x30)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauGia.c"
                      ,0xc0,
                      "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      iVar3 = Abc_TtReadHex((word *)Fanins,(char *)pbVar12);
      iVar4 = 1 << ((char)iVar3 - 2U & 0x1f);
      if (iVar3 < 3) {
        iVar4 = 1;
      }
      pcVar6 = *p;
      pcVar11 = pcVar6 + iVar4;
      *p = pcVar11;
      if ((pcVar6[iVar4] != '{') ||
         (pcVar6 = pStr + pMatches[(long)pcVar11 - (long)pStr], *pcVar6 != '}')) {
        __assert_fail("**p == \'{\' && *q == \'}\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauGia.c"
                      ,0xb3,
                      "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      pcVar11 = pcVar11 + 1;
      *p = pcVar11;
      lVar8 = 0;
      while (pcVar11 < pcVar6) {
        iVar4 = Dau_DsdToGia2_rec(pGia,pStr,p,pMatches,pLits,vCover);
        Temp[lVar8] = iVar4;
        pcVar11 = *p + 1;
        *p = pcVar11;
        lVar8 = lVar8 + 1;
      }
      if (iVar3 != (int)lVar8) {
        __assert_fail("i == nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauGia.c"
                      ,0xb6,
                      "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      if (pcVar11 != pcVar6) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauGia.c"
                      ,0xb7,
                      "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      vLeaves.pArray = Temp;
      vLeaves.nCap = iVar3;
      vLeaves.nSize = iVar3;
      iVar4 = Kit_TruthToGia(pGia,(uint *)Fanins,iVar3,vCover,&vLeaves,1);
      m_Non1Step = m_Non1Step + 1;
    }
    iVar4 = Abc_LitNotCond(iVar4,uVar10);
    return iVar4;
  }
  iVar4 = pMatches[(long)pbVar12 - (long)pStr];
  if (pStr[iVar4] == ']') {
    iVar3 = 0;
    while( true ) {
      pbVar12 = pbVar12 + 1;
      *p = (char *)pbVar12;
      if (pStr + iVar4 <= pbVar12) break;
      iVar2 = Dau_DsdToGia2_rec(pGia,pStr,p,pMatches,pLits,vCover);
      if (pGia->pMuxes == (uint *)0x0) {
        iVar3 = Gia_ManHashXor(pGia,iVar3,iVar2);
      }
      else {
        iVar3 = Gia_ManHashXorReal(pGia,iVar3,iVar2);
      }
      pbVar12 = (byte *)*p;
    }
    if (pbVar12 == (byte *)(pStr + iVar4)) goto LAB_00432ce2;
    pcVar11 = "*p == q";
    uVar10 = 0x79;
  }
  else {
    pcVar11 = "**p == \'[\' && *q == \']\'";
    uVar10 = 0x70;
  }
LAB_00432f52:
  __assert_fail(pcVar11,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauGia.c"
                ,uVar10,
                "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)");
}

Assistant:

int Dau_DsdToGia2_rec( Gia_Man_t * pGia, char * pStr, char ** p, int * pMatches, int * pLits, Vec_Int_t * vCover )
{
    int fCompl = 0;
    if ( **p == '!' )
        (*p)++, fCompl = 1;
    if ( **p >= 'a' && **p < 'a' + DAU_DSD_MAX_VAR ) // var
        return Abc_LitNotCond( pLits[**p - 'a'], fCompl );
    if ( **p == '(' ) // and/or
    {
        char * q = pStr + pMatches[ *p - pStr ];
        int Res = 1, Lit;
        assert( **p == '(' && *q == ')' );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Lit = Dau_DsdToGia2_rec( pGia, pStr, p, pMatches, pLits, vCover );
            Res = Gia_ManHashAnd( pGia, Res, Lit );
        }
        assert( *p == q );
        return Abc_LitNotCond( Res, fCompl );
    }
    if ( **p == '[' ) // xor
    {
        char * q = pStr + pMatches[ *p - pStr ];
        int Res = 0, Lit;
        assert( **p == '[' && *q == ']' );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Lit = Dau_DsdToGia2_rec( pGia, pStr, p, pMatches, pLits, vCover );
            if ( pGia->pMuxes )
                Res = Gia_ManHashXorReal( pGia, Res, Lit );
            else
                Res = Gia_ManHashXor( pGia, Res, Lit );
        }
        assert( *p == q );
        return Abc_LitNotCond( Res, fCompl );
    }
    if ( **p == '<' ) // mux
    {
        int nVars = 0;
        int Temp[3], * pTemp = Temp, Res;
        int Fanins[DAU_DSD_MAX_VAR], * pLits2;
        char * pOld = *p;
        char * q = pStr + pMatches[ *p - pStr ];
        // read fanins
        if ( *(q+1) == '{' )
        {
            char * q2;
            *p = q+1;
            q2 = pStr + pMatches[ *p - pStr ];
            assert( **p == '{' && *q2 == '}' );
            for ( nVars = 0, (*p)++; *p < q2; (*p)++, nVars++ )
                Fanins[nVars] = Dau_DsdToGia2_rec( pGia, pStr, p, pMatches, pLits, vCover );
            assert( *p == q2 );
            pLits2 = Fanins;
        }
        else
            pLits2 = pLits;
        // read MUX
        *p = pOld;
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '<' && *q == '>' );
        // verify internal variables
        if ( nVars )
            for ( ; pOld < q; pOld++ )
                if ( *pOld >= 'a' && *pOld <= 'z' )
                    assert( *pOld - 'a' < nVars );
        // derive MUX components
        for ( (*p)++; *p < q; (*p)++ )
            *pTemp++ = Dau_DsdToGia2_rec( pGia, pStr, p, pMatches, pLits2, vCover );
        assert( pTemp == Temp + 3 );
        assert( *p == q );
        if ( *(q+1) == '{' ) // and/or
        {
            char * q = pStr + pMatches[ ++(*p) - pStr ];
            assert( **p == '{' && *q == '}' );
            *p = q;
        }
        if ( pGia->pMuxes )
            Res = Gia_ManHashMuxReal( pGia, Temp[0], Temp[1], Temp[2] );
        else
            Res = Gia_ManHashMux( pGia, Temp[0], Temp[1], Temp[2] );
        return Abc_LitNotCond( Res, fCompl );
    }
    if ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
    {
        Vec_Int_t vLeaves;  char * q;
        word pFunc[DAU_DSD_MAX_VAR > 6 ? (1 << (DAU_DSD_MAX_VAR-6)) : 1];
        int Fanins[DAU_DSD_MAX_VAR], Res; 
        int i, nVars = Abc_TtReadHex( pFunc, *p );
        *p += Abc_TtHexDigitNum( nVars );
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '{' && *q == '}' );
        for ( i = 0, (*p)++; *p < q; (*p)++, i++ )
            Fanins[i] = Dau_DsdToGia2_rec( pGia, pStr, p, pMatches, pLits, vCover );
        assert( i == nVars );
        assert( *p == q );
//        Res = Dau_DsdToGia2Compose_rec( pGia, Func, Fanins, nVars );
        vLeaves.nCap = nVars;
        vLeaves.nSize = nVars;
        vLeaves.pArray = Fanins;        
        Res = Kit_TruthToGia( pGia, (unsigned *)pFunc, nVars, vCover, &vLeaves, 1 );
        m_Non1Step++;
        return Abc_LitNotCond( Res, fCompl );
    }
    assert( 0 );
    return 0;
}